

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O0

void __thiscall
caffe::SolverParameter::SerializeWithCachedSizes(SolverParameter *this,CodedOutputStream *output)

{
  uint uVar1;
  bool bVar2;
  int iVar3;
  int size;
  int32 iVar4;
  SolverParameter_SolverMode value;
  uint uVar5;
  SolverParameter_SolverType value_00;
  SolverParameter_SnapshotFormat value_01;
  char *pcVar6;
  string *psVar7;
  int64 value_02;
  NetParameter *value_03;
  NetState *value_04;
  UnknownFieldSet *unknown_fields;
  float fVar8;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double extraout_XMM0_Qa_01;
  double extraout_XMM0_Qa_02;
  double extraout_XMM0_Qa_03;
  double extraout_XMM0_Qa_04;
  double extraout_XMM0_Qa_05;
  double dVar9;
  int local_80;
  int n_4;
  int i_4;
  uint n_3;
  uint i_3;
  uint n_2;
  uint i_2;
  int n_1;
  int i_1;
  int n;
  int i;
  uint32 cached_has_bits;
  CodedOutputStream *output_local;
  SolverParameter *this_local;
  
  uVar1 = (this->_has_bits_).has_bits_[0];
  if ((uVar1 & 1) != 0) {
    train_net_abi_cxx11_(this);
    pcVar6 = (char *)std::__cxx11::string::data();
    train_net_abi_cxx11_(this);
    iVar3 = std::__cxx11::string::length();
    google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField
              (pcVar6,iVar3,SERIALIZE,"caffe.SolverParameter.train_net");
    psVar7 = train_net_abi_cxx11_(this);
    google::protobuf::internal::WireFormatLite::WriteStringMaybeAliased(1,psVar7,output);
  }
  i_1 = 0;
  iVar3 = test_net_size(this);
  for (; i_1 < iVar3; i_1 = i_1 + 1) {
    test_net_abi_cxx11_(this,i_1);
    pcVar6 = (char *)std::__cxx11::string::data();
    test_net_abi_cxx11_(this,i_1);
    size = std::__cxx11::string::length();
    google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField
              (pcVar6,size,SERIALIZE,"caffe.SolverParameter.test_net");
    psVar7 = test_net_abi_cxx11_(this,i_1);
    google::protobuf::internal::WireFormatLite::WriteString(2,psVar7,output);
  }
  i_2 = 0;
  iVar3 = test_iter_size(this);
  dVar9 = extraout_XMM0_Qa;
  for (; (int)i_2 < iVar3; i_2 = i_2 + 1) {
    iVar4 = test_iter(this,i_2);
    google::protobuf::internal::WireFormatLite::WriteInt32(3,iVar4,output);
    dVar9 = extraout_XMM0_Qa_00;
  }
  if ((uVar1 & 0x200) != 0) {
    iVar4 = test_interval(this);
    google::protobuf::internal::WireFormatLite::WriteInt32(4,iVar4,output);
    dVar9 = extraout_XMM0_Qa_01;
  }
  if ((uVar1 & 0x400) != 0) {
    fVar8 = base_lr(this);
    google::protobuf::internal::WireFormatLite::WriteFloat(5,fVar8,output);
    dVar9 = extraout_XMM0_Qa_02;
  }
  if ((uVar1 & 0x800) != 0) {
    iVar4 = display(this);
    google::protobuf::internal::WireFormatLite::WriteInt32(6,iVar4,output);
    dVar9 = extraout_XMM0_Qa_03;
  }
  if ((uVar1 & 0x1000) != 0) {
    iVar4 = max_iter(this);
    google::protobuf::internal::WireFormatLite::WriteInt32(7,iVar4,output);
    dVar9 = extraout_XMM0_Qa_04;
  }
  if ((uVar1 & 2) != 0) {
    lr_policy_abi_cxx11_(this);
    pcVar6 = (char *)std::__cxx11::string::data();
    lr_policy_abi_cxx11_(this);
    iVar3 = std::__cxx11::string::length();
    google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField
              (pcVar6,iVar3,SERIALIZE,"caffe.SolverParameter.lr_policy");
    psVar7 = lr_policy_abi_cxx11_(this);
    google::protobuf::internal::WireFormatLite::WriteStringMaybeAliased(8,psVar7,output);
    dVar9 = extraout_XMM0_Qa_05;
  }
  if ((uVar1 & 0x2000) != 0) {
    dVar9 = gamma(this,dVar9);
    google::protobuf::internal::WireFormatLite::WriteFloat(9,SUB84(dVar9,0),output);
  }
  if ((uVar1 & 0x4000) != 0) {
    fVar8 = power(this);
    google::protobuf::internal::WireFormatLite::WriteFloat(10,fVar8,output);
  }
  if ((uVar1 & 0x8000) != 0) {
    fVar8 = momentum(this);
    google::protobuf::internal::WireFormatLite::WriteFloat(0xb,fVar8,output);
  }
  if ((uVar1 & 0x10000) != 0) {
    fVar8 = weight_decay(this);
    google::protobuf::internal::WireFormatLite::WriteFloat(0xc,fVar8,output);
  }
  if ((uVar1 & 0x20000) != 0) {
    iVar4 = stepsize(this);
    google::protobuf::internal::WireFormatLite::WriteInt32(0xd,iVar4,output);
  }
  if ((uVar1 & 0x40000) != 0) {
    iVar4 = snapshot(this);
    google::protobuf::internal::WireFormatLite::WriteInt32(0xe,iVar4,output);
  }
  if ((uVar1 & 4) != 0) {
    snapshot_prefix_abi_cxx11_(this);
    pcVar6 = (char *)std::__cxx11::string::data();
    snapshot_prefix_abi_cxx11_(this);
    iVar3 = std::__cxx11::string::length();
    google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField
              (pcVar6,iVar3,SERIALIZE,"caffe.SolverParameter.snapshot_prefix");
    psVar7 = snapshot_prefix_abi_cxx11_(this);
    google::protobuf::internal::WireFormatLite::WriteStringMaybeAliased(0xf,psVar7,output);
  }
  if ((uVar1 & 0x200000) != 0) {
    bVar2 = snapshot_diff(this);
    google::protobuf::internal::WireFormatLite::WriteBool(0x10,bVar2,output);
  }
  if ((uVar1 & 0x4000000) != 0) {
    value = solver_mode(this);
    google::protobuf::internal::WireFormatLite::WriteEnum(0x11,value,output);
  }
  if ((uVar1 & 0x80000) != 0) {
    iVar4 = device_id(this);
    google::protobuf::internal::WireFormatLite::WriteInt32(0x12,iVar4,output);
  }
  if ((uVar1 & 0x100000) != 0) {
    bVar2 = test_compute_loss(this);
    google::protobuf::internal::WireFormatLite::WriteBool(0x13,bVar2,output);
  }
  if ((uVar1 & 0x2000000) != 0) {
    value_02 = random_seed(this);
    google::protobuf::internal::WireFormatLite::WriteInt64(0x14,value_02,output);
  }
  if ((uVar1 & 0x40) != 0) {
    google::protobuf::internal::WireFormatLite::WriteMessageMaybeToArray
              (0x15,(MessageLite *)this->train_net_param_,output);
  }
  i_3 = 0;
  uVar5 = test_net_param_size(this);
  for (; i_3 < uVar5; i_3 = i_3 + 1) {
    value_03 = test_net_param(this,i_3);
    google::protobuf::internal::WireFormatLite::WriteMessageMaybeToArray
              (0x16,(MessageLite *)value_03,output);
  }
  if ((uVar1 & 0x400000) != 0) {
    bVar2 = debug_info(this);
    google::protobuf::internal::WireFormatLite::WriteBool(0x17,bVar2,output);
  }
  if ((uVar1 & 8) != 0) {
    net_abi_cxx11_(this);
    pcVar6 = (char *)std::__cxx11::string::data();
    net_abi_cxx11_(this);
    iVar3 = std::__cxx11::string::length();
    google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField
              (pcVar6,iVar3,SERIALIZE,"caffe.SolverParameter.net");
    psVar7 = net_abi_cxx11_(this);
    google::protobuf::internal::WireFormatLite::WriteStringMaybeAliased(0x18,psVar7,output);
  }
  if ((uVar1 & 0x80) != 0) {
    google::protobuf::internal::WireFormatLite::WriteMessageMaybeToArray
              (0x19,(MessageLite *)this->net_param_,output);
  }
  if ((uVar1 & 0x100) != 0) {
    google::protobuf::internal::WireFormatLite::WriteMessageMaybeToArray
              (0x1a,(MessageLite *)this->train_state_,output);
  }
  i_4 = 0;
  uVar5 = test_state_size(this);
  for (; (uint)i_4 < uVar5; i_4 = i_4 + 1) {
    value_04 = test_state(this,i_4);
    google::protobuf::internal::WireFormatLite::WriteMessageMaybeToArray
              (0x1b,(MessageLite *)value_04,output);
  }
  if ((uVar1 & 0x10000000) != 0) {
    bVar2 = snapshot_after_train(this);
    google::protobuf::internal::WireFormatLite::WriteBool(0x1c,bVar2,output);
  }
  if ((uVar1 & 0x10) != 0) {
    regularization_type_abi_cxx11_(this);
    pcVar6 = (char *)std::__cxx11::string::data();
    regularization_type_abi_cxx11_(this);
    iVar3 = std::__cxx11::string::length();
    google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField
              (pcVar6,iVar3,SERIALIZE,"caffe.SolverParameter.regularization_type");
    psVar7 = regularization_type_abi_cxx11_(this);
    google::protobuf::internal::WireFormatLite::WriteStringMaybeAliased(0x1d,psVar7,output);
  }
  if ((uVar1 & 0x800000) != 0) {
    value_00 = solver_type(this);
    google::protobuf::internal::WireFormatLite::WriteEnum(0x1e,value_00,output);
  }
  if ((uVar1 & 0x20000000) != 0) {
    fVar8 = delta(this);
    google::protobuf::internal::WireFormatLite::WriteFloat(0x1f,fVar8,output);
  }
  if ((uVar1 & 0x8000000) != 0) {
    bVar2 = test_initialization(this);
    google::protobuf::internal::WireFormatLite::WriteBool(0x20,bVar2,output);
  }
  if ((uVar1 & 0x40000000) != 0) {
    iVar4 = average_loss(this);
    google::protobuf::internal::WireFormatLite::WriteInt32(0x21,iVar4,output);
  }
  local_80 = 0;
  iVar3 = stepvalue_size(this);
  for (; local_80 < iVar3; local_80 = local_80 + 1) {
    iVar4 = stepvalue(this,local_80);
    google::protobuf::internal::WireFormatLite::WriteInt32(0x22,iVar4,output);
  }
  if ((uVar1 & 0x80000000) != 0) {
    fVar8 = clip_gradients(this);
    google::protobuf::internal::WireFormatLite::WriteFloat(0x23,fVar8,output);
  }
  uVar1 = (this->_has_bits_).has_bits_[1];
  if ((uVar1 & 1) != 0) {
    iVar4 = iter_size(this);
    google::protobuf::internal::WireFormatLite::WriteInt32(0x24,iVar4,output);
  }
  if ((uVar1 & 2) != 0) {
    value_01 = snapshot_format(this);
    google::protobuf::internal::WireFormatLite::WriteEnum(0x25,value_01,output);
  }
  if ((uVar1 & 4) != 0) {
    fVar8 = rms_decay(this);
    google::protobuf::internal::WireFormatLite::WriteFloat(0x26,fVar8,output);
  }
  uVar1 = (this->_has_bits_).has_bits_[0];
  if ((uVar1 & 0x1000000) != 0) {
    fVar8 = momentum2(this);
    google::protobuf::internal::WireFormatLite::WriteFloat(0x27,fVar8,output);
  }
  if ((uVar1 & 0x20) != 0) {
    type_abi_cxx11_(this);
    pcVar6 = (char *)std::__cxx11::string::data();
    type_abi_cxx11_(this);
    iVar3 = std::__cxx11::string::length();
    google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField
              (pcVar6,iVar3,SERIALIZE,"caffe.SolverParameter.type");
    psVar7 = type_abi_cxx11_(this);
    google::protobuf::internal::WireFormatLite::WriteStringMaybeAliased(0x28,psVar7,output);
  }
  if (((uint)(this->_internal_metadata_).
             super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
             .ptr_ & 1) == 1) {
    unknown_fields = SolverParameter::unknown_fields(this);
    google::protobuf::internal::WireFormat::SerializeUnknownFields(unknown_fields,output);
  }
  return;
}

Assistant:

void SolverParameter::SerializeWithCachedSizes(
    ::google::protobuf::io::CodedOutputStream* output) const {
  // @@protoc_insertion_point(serialize_start:caffe.SolverParameter)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  cached_has_bits = _has_bits_[0];
  // optional string train_net = 1;
  if (cached_has_bits & 0x00000001u) {
    ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
      this->train_net().data(), this->train_net().length(),
      ::google::protobuf::internal::WireFormat::SERIALIZE,
      "caffe.SolverParameter.train_net");
    ::google::protobuf::internal::WireFormatLite::WriteStringMaybeAliased(
      1, this->train_net(), output);
  }

  // repeated string test_net = 2;
  for (int i = 0, n = this->test_net_size(); i < n; i++) {
    ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
      this->test_net(i).data(), this->test_net(i).length(),
      ::google::protobuf::internal::WireFormat::SERIALIZE,
      "caffe.SolverParameter.test_net");
    ::google::protobuf::internal::WireFormatLite::WriteString(
      2, this->test_net(i), output);
  }

  // repeated int32 test_iter = 3;
  for (int i = 0, n = this->test_iter_size(); i < n; i++) {
    ::google::protobuf::internal::WireFormatLite::WriteInt32(
      3, this->test_iter(i), output);
  }

  // optional int32 test_interval = 4 [default = 0];
  if (cached_has_bits & 0x00000200u) {
    ::google::protobuf::internal::WireFormatLite::WriteInt32(4, this->test_interval(), output);
  }

  // optional float base_lr = 5;
  if (cached_has_bits & 0x00000400u) {
    ::google::protobuf::internal::WireFormatLite::WriteFloat(5, this->base_lr(), output);
  }

  // optional int32 display = 6;
  if (cached_has_bits & 0x00000800u) {
    ::google::protobuf::internal::WireFormatLite::WriteInt32(6, this->display(), output);
  }

  // optional int32 max_iter = 7;
  if (cached_has_bits & 0x00001000u) {
    ::google::protobuf::internal::WireFormatLite::WriteInt32(7, this->max_iter(), output);
  }

  // optional string lr_policy = 8;
  if (cached_has_bits & 0x00000002u) {
    ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
      this->lr_policy().data(), this->lr_policy().length(),
      ::google::protobuf::internal::WireFormat::SERIALIZE,
      "caffe.SolverParameter.lr_policy");
    ::google::protobuf::internal::WireFormatLite::WriteStringMaybeAliased(
      8, this->lr_policy(), output);
  }

  // optional float gamma = 9;
  if (cached_has_bits & 0x00002000u) {
    ::google::protobuf::internal::WireFormatLite::WriteFloat(9, this->gamma(), output);
  }

  // optional float power = 10;
  if (cached_has_bits & 0x00004000u) {
    ::google::protobuf::internal::WireFormatLite::WriteFloat(10, this->power(), output);
  }

  // optional float momentum = 11;
  if (cached_has_bits & 0x00008000u) {
    ::google::protobuf::internal::WireFormatLite::WriteFloat(11, this->momentum(), output);
  }

  // optional float weight_decay = 12;
  if (cached_has_bits & 0x00010000u) {
    ::google::protobuf::internal::WireFormatLite::WriteFloat(12, this->weight_decay(), output);
  }

  // optional int32 stepsize = 13;
  if (cached_has_bits & 0x00020000u) {
    ::google::protobuf::internal::WireFormatLite::WriteInt32(13, this->stepsize(), output);
  }

  // optional int32 snapshot = 14 [default = 0];
  if (cached_has_bits & 0x00040000u) {
    ::google::protobuf::internal::WireFormatLite::WriteInt32(14, this->snapshot(), output);
  }

  // optional string snapshot_prefix = 15;
  if (cached_has_bits & 0x00000004u) {
    ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
      this->snapshot_prefix().data(), this->snapshot_prefix().length(),
      ::google::protobuf::internal::WireFormat::SERIALIZE,
      "caffe.SolverParameter.snapshot_prefix");
    ::google::protobuf::internal::WireFormatLite::WriteStringMaybeAliased(
      15, this->snapshot_prefix(), output);
  }

  // optional bool snapshot_diff = 16 [default = false];
  if (cached_has_bits & 0x00200000u) {
    ::google::protobuf::internal::WireFormatLite::WriteBool(16, this->snapshot_diff(), output);
  }

  // optional .caffe.SolverParameter.SolverMode solver_mode = 17 [default = GPU];
  if (cached_has_bits & 0x04000000u) {
    ::google::protobuf::internal::WireFormatLite::WriteEnum(
      17, this->solver_mode(), output);
  }

  // optional int32 device_id = 18 [default = 0];
  if (cached_has_bits & 0x00080000u) {
    ::google::protobuf::internal::WireFormatLite::WriteInt32(18, this->device_id(), output);
  }

  // optional bool test_compute_loss = 19 [default = false];
  if (cached_has_bits & 0x00100000u) {
    ::google::protobuf::internal::WireFormatLite::WriteBool(19, this->test_compute_loss(), output);
  }

  // optional int64 random_seed = 20 [default = -1];
  if (cached_has_bits & 0x02000000u) {
    ::google::protobuf::internal::WireFormatLite::WriteInt64(20, this->random_seed(), output);
  }

  // optional .caffe.NetParameter train_net_param = 21;
  if (cached_has_bits & 0x00000040u) {
    ::google::protobuf::internal::WireFormatLite::WriteMessageMaybeToArray(
      21, *this->train_net_param_, output);
  }

  // repeated .caffe.NetParameter test_net_param = 22;
  for (unsigned int i = 0, n = this->test_net_param_size(); i < n; i++) {
    ::google::protobuf::internal::WireFormatLite::WriteMessageMaybeToArray(
      22, this->test_net_param(i), output);
  }

  // optional bool debug_info = 23 [default = false];
  if (cached_has_bits & 0x00400000u) {
    ::google::protobuf::internal::WireFormatLite::WriteBool(23, this->debug_info(), output);
  }

  // optional string net = 24;
  if (cached_has_bits & 0x00000008u) {
    ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
      this->net().data(), this->net().length(),
      ::google::protobuf::internal::WireFormat::SERIALIZE,
      "caffe.SolverParameter.net");
    ::google::protobuf::internal::WireFormatLite::WriteStringMaybeAliased(
      24, this->net(), output);
  }

  // optional .caffe.NetParameter net_param = 25;
  if (cached_has_bits & 0x00000080u) {
    ::google::protobuf::internal::WireFormatLite::WriteMessageMaybeToArray(
      25, *this->net_param_, output);
  }

  // optional .caffe.NetState train_state = 26;
  if (cached_has_bits & 0x00000100u) {
    ::google::protobuf::internal::WireFormatLite::WriteMessageMaybeToArray(
      26, *this->train_state_, output);
  }

  // repeated .caffe.NetState test_state = 27;
  for (unsigned int i = 0, n = this->test_state_size(); i < n; i++) {
    ::google::protobuf::internal::WireFormatLite::WriteMessageMaybeToArray(
      27, this->test_state(i), output);
  }

  // optional bool snapshot_after_train = 28 [default = true];
  if (cached_has_bits & 0x10000000u) {
    ::google::protobuf::internal::WireFormatLite::WriteBool(28, this->snapshot_after_train(), output);
  }

  // optional string regularization_type = 29 [default = "L2"];
  if (cached_has_bits & 0x00000010u) {
    ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
      this->regularization_type().data(), this->regularization_type().length(),
      ::google::protobuf::internal::WireFormat::SERIALIZE,
      "caffe.SolverParameter.regularization_type");
    ::google::protobuf::internal::WireFormatLite::WriteStringMaybeAliased(
      29, this->regularization_type(), output);
  }

  // optional .caffe.SolverParameter.SolverType solver_type = 30 [default = SGD];
  if (cached_has_bits & 0x00800000u) {
    ::google::protobuf::internal::WireFormatLite::WriteEnum(
      30, this->solver_type(), output);
  }

  // optional float delta = 31 [default = 1e-08];
  if (cached_has_bits & 0x20000000u) {
    ::google::protobuf::internal::WireFormatLite::WriteFloat(31, this->delta(), output);
  }

  // optional bool test_initialization = 32 [default = true];
  if (cached_has_bits & 0x08000000u) {
    ::google::protobuf::internal::WireFormatLite::WriteBool(32, this->test_initialization(), output);
  }

  // optional int32 average_loss = 33 [default = 1];
  if (cached_has_bits & 0x40000000u) {
    ::google::protobuf::internal::WireFormatLite::WriteInt32(33, this->average_loss(), output);
  }

  // repeated int32 stepvalue = 34;
  for (int i = 0, n = this->stepvalue_size(); i < n; i++) {
    ::google::protobuf::internal::WireFormatLite::WriteInt32(
      34, this->stepvalue(i), output);
  }

  // optional float clip_gradients = 35 [default = -1];
  if (cached_has_bits & 0x80000000u) {
    ::google::protobuf::internal::WireFormatLite::WriteFloat(35, this->clip_gradients(), output);
  }

  cached_has_bits = _has_bits_[1];
  // optional int32 iter_size = 36 [default = 1];
  if (cached_has_bits & 0x00000001u) {
    ::google::protobuf::internal::WireFormatLite::WriteInt32(36, this->iter_size(), output);
  }

  // optional .caffe.SolverParameter.SnapshotFormat snapshot_format = 37 [default = BINARYPROTO];
  if (cached_has_bits & 0x00000002u) {
    ::google::protobuf::internal::WireFormatLite::WriteEnum(
      37, this->snapshot_format(), output);
  }

  // optional float rms_decay = 38 [default = 0.99];
  if (cached_has_bits & 0x00000004u) {
    ::google::protobuf::internal::WireFormatLite::WriteFloat(38, this->rms_decay(), output);
  }

  cached_has_bits = _has_bits_[0];
  // optional float momentum2 = 39 [default = 0.999];
  if (cached_has_bits & 0x01000000u) {
    ::google::protobuf::internal::WireFormatLite::WriteFloat(39, this->momentum2(), output);
  }

  // optional string type = 40 [default = "SGD"];
  if (cached_has_bits & 0x00000020u) {
    ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
      this->type().data(), this->type().length(),
      ::google::protobuf::internal::WireFormat::SERIALIZE,
      "caffe.SolverParameter.type");
    ::google::protobuf::internal::WireFormatLite::WriteStringMaybeAliased(
      40, this->type(), output);
  }

  if (_internal_metadata_.have_unknown_fields()) {
    ::google::protobuf::internal::WireFormat::SerializeUnknownFields(
        unknown_fields(), output);
  }
  // @@protoc_insertion_point(serialize_end:caffe.SolverParameter)
}